

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQClassMember>::resize
          (sqvector<SQClassMember> *this,SQUnsignedInteger newsize,SQClassMember *fill)

{
  ulong local_28;
  SQUnsignedInteger i;
  SQClassMember *fill_local;
  SQUnsignedInteger newsize_local;
  sqvector<SQClassMember> *this_local;
  
  if (this->_allocated < newsize) {
    _realloc(this,newsize);
  }
  local_28 = newsize;
  if (this->_size < newsize) {
    while (this->_size < newsize) {
      SQClassMember::SQClassMember(this->_vals + this->_size,fill);
      this->_size = this->_size + 1;
    }
  }
  else {
    for (; local_28 < this->_size; local_28 = local_28 + 1) {
      SQClassMember::~SQClassMember(this->_vals + local_28);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }